

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void anon_unknown.dwarf_60862a::CreateGeneratedSource
               (cmLocalGenerator *lg,string *output,OutputRole role,cmCommandOrigin origin,
               cmListFileBacktrace *lfbt)

{
  bool bVar1;
  size_type sVar2;
  cmake *pcVar3;
  cmMakefile *pcVar4;
  char *args;
  cmAlphaNum local_188;
  string_view local_158;
  cmAlphaNum local_148;
  string local_118;
  long local_f8;
  size_type pos;
  string_view local_c0;
  cmAlphaNum local_b0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmListFileBacktrace *local_28;
  cmListFileBacktrace *lfbt_local;
  cmCommandOrigin origin_local;
  OutputRole role_local;
  string *output_local;
  cmLocalGenerator *lg_local;
  
  local_28 = lfbt;
  lfbt_local._0_4_ = origin;
  lfbt_local._4_4_ = role;
  _origin_local = output;
  output_local = (string *)lg;
  sVar2 = cmGeneratorExpression::Find(output);
  if (sVar2 == 0xffffffffffffffff) {
    pcVar4 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)output_local);
    bVar1 = cmMakefile::CanIWriteThisFile(pcVar4,_origin_local);
    if (bVar1) {
      local_f8 = std::__cxx11::string::find_first_of((char *)_origin_local,0xd2e541);
      if (local_f8 == -1) {
        if ((cmCommandOrigin)lfbt_local == Generator) {
          pcVar4 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)output_local);
          cmMakefile::GetOrCreateGeneratedSource(pcVar4,_origin_local);
        }
      }
      else {
        pcVar3 = cmLocalGenerator::GetCMakeInstance((cmLocalGenerator *)output_local);
        local_158 = CustomOutputRoleKeyword(lfbt_local._4_4_);
        cmAlphaNum::cmAlphaNum(&local_148,local_158);
        cmAlphaNum::cmAlphaNum(&local_188," containing a \"");
        args = (char *)std::__cxx11::string::operator[]((ulong)_origin_local);
        cmStrCat<char,char[18]>
                  (&local_118,&local_148,&local_188,args,(char (*) [18])"\" is not allowed.");
        cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_118,local_28);
        std::__cxx11::string::~string((string *)&local_118);
      }
    }
    else {
      pcVar3 = cmLocalGenerator::GetCMakeInstance((cmLocalGenerator *)output_local);
      local_c0 = CustomOutputRoleKeyword(lfbt_local._4_4_);
      cmAlphaNum::cmAlphaNum(&local_b0,local_c0);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&pos," path\n  ");
      cmStrCat<std::__cxx11::string,char[55]>
                (&local_80,&local_b0,(cmAlphaNum *)&pos,_origin_local,
                 (char (*) [55])"\nin a source directory as an output of custom command.");
      cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_80,local_28);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  else {
    pcVar3 = cmLocalGenerator::GetCMakeInstance((cmLocalGenerator *)output_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "Generator expressions in custom command outputs are not implemented!",&local_49);
    cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_48,local_28);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return;
}

Assistant:

void CreateGeneratedSource(cmLocalGenerator& lg, const std::string& output,
                           cmLocalGenerator::OutputRole role,
                           cmCommandOrigin origin,
                           const cmListFileBacktrace& lfbt)
{
  if (cmGeneratorExpression::Find(output) != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Generator expressions in custom command outputs are not implemented!",
      lfbt);
    return;
  }

  // Make sure the file will not be generated into the source
  // directory during an out of source build.
  if (!lg.GetMakefile()->CanIWriteThisFile(output)) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " path\n  ", output,
               "\nin a source directory as an output of custom command."),
      lfbt);
    return;
  }

  // Make sure the output file name has no invalid characters.
  std::string::size_type pos = output.find_first_of("#<>");
  if (pos != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " containing a \"", output[pos],
               "\" is not allowed."),
      lfbt);
    return;
  }

  // Outputs without generator expressions from the project are already
  // created and marked as generated.  Do not mark them again, because
  // other commands might have overwritten the property.
  if (origin == cmCommandOrigin::Generator) {
    lg.GetMakefile()->GetOrCreateGeneratedSource(output);
  }
}